

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O0

void __thiscall SynthWidget::setEmuModeText(SynthWidget *this)

{
  QLabel *pQVar1;
  ROMInfo *pRVar2;
  char *local_70;
  QString local_60;
  ROMImage *local_38;
  ROMImage *pcmROMImage;
  ROMImage *controlROMImage;
  QString emuMode;
  SynthWidget *this_local;
  
  emuMode.d.size = (qsizetype)this;
  QString::QString((QString *)&controlROMImage);
  pcmROMImage = (ROMImage *)0x0;
  local_38 = (ROMImage *)0x0;
  SynthRoute::getROMImages(this->synthRoute,&pcmROMImage,&local_38);
  if (pcmROMImage == (ROMImage *)0x0) {
    local_70 = "Unknown";
  }
  else {
    pRVar2 = MT32Emu::ROMImage::getROMInfo(pcmROMImage);
    local_70 = pRVar2->description;
  }
  QString::operator=((QString *)&controlROMImage,local_70);
  pQVar1 = (this->ui->super_Ui_SynthWidget).synthEmuModeLabel;
  ::operator+(&local_60,"Emulation Mode: ",(QString *)&controlROMImage);
  QLabel::setText((QString *)pQVar1);
  QString::~QString(&local_60);
  QString::~QString((QString *)&controlROMImage);
  return;
}

Assistant:

void SynthWidget::setEmuModeText() {
	QString emuMode;
	const MT32Emu::ROMImage *controlROMImage = NULL;
	const MT32Emu::ROMImage *pcmROMImage = NULL;
	synthRoute->getROMImages(controlROMImage, pcmROMImage);
	emuMode = controlROMImage == NULL ? "Unknown" : controlROMImage->getROMInfo()->description;
	ui->synthEmuModeLabel->setText("Emulation Mode: " + emuMode);
}